

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O2

ResultStats *
deqp::gls::anon_unknown_1::calculateStats
          (ResultStats *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *values)

{
  unsigned_long uVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sortedValues;
  
  __return_storage_ptr__->variance = 0.0;
  __return_storage_ptr__->min = 0;
  __return_storage_ptr__->max = 0;
  __return_storage_ptr__->median = 0.0;
  __return_storage_ptr__->mean = 0.0;
  __return_storage_ptr__->min = 0xffffffffffffffff;
  puVar2 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  uVar5 = (long)uVar8 >> 3;
  uVar6 = 0;
  uVar4 = 0;
  if (0 < (int)uVar5) {
    uVar4 = uVar5 & 0xffffffff;
  }
  lVar7 = 0;
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    lVar7 = lVar7 + puVar2[uVar6];
  }
  auVar12._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar12._0_8_ = lVar7;
  auVar12._12_4_ = 0x45300000;
  auVar14._8_4_ = (int)((long)uVar8 >> 0x23);
  auVar14._0_8_ = uVar5;
  auVar14._12_4_ = 0x45300000;
  dVar11 = (auVar14._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
  dVar10 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / dVar11;
  __return_storage_ptr__->mean = dVar10;
  dVar13 = 0.0;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = puVar2[uVar5];
    auVar15._8_4_ = (int)(uVar1 >> 0x20);
    auVar15._0_8_ = uVar1;
    auVar15._12_4_ = 0x45300000;
    dVar16 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) - dVar10;
    dVar13 = dVar13 + dVar16 * dVar16;
  }
  __return_storage_ptr__->variance = dVar13 / dVar11;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&sortedValues,values);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (sortedValues.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             sortedValues.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  auVar9._0_8_ = (double)CONCAT44(0x43300000,
                                  (int)sortedValues.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start[(int)(uVar8 >> 4)])
  ;
  auVar9._8_4_ = (int)(sortedValues.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)(uVar8 >> 4)] >> 0x20);
  auVar9._12_4_ = 0x45300000;
  __return_storage_ptr__->median =
       (auVar9._8_8_ - 1.9342813113834067e+25) + (auVar9._0_8_ - 4503599627370496.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&sortedValues.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  puVar2 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 3;
  uVar6 = 0;
  uVar4 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar4 = uVar6;
  }
  uVar5 = 0xffffffffffffffff;
  uVar8 = 0;
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    uVar3 = puVar2[uVar6];
    if (uVar3 < uVar5) {
      uVar5 = uVar3;
    }
    if (uVar8 <= uVar3) {
      uVar8 = uVar3;
    }
  }
  __return_storage_ptr__->max = uVar8;
  __return_storage_ptr__->min = uVar5;
  return __return_storage_ptr__;
}

Assistant:

ResultStats calculateStats (const vector<deUint64>& values)
{
	ResultStats result = { 0.0, 0.0, 0.0, 0xFFFFFFFFFFFFFFFFu, 0 };

	deUint64 sum = 0;

	for (int i = 0; i < (int)values.size(); i++)
		sum += values[i];

	result.mean = ((double)sum) / (double)values.size();

	for (int i = 0; i < (int)values.size(); i++)
	{
		const double val = (double)values[i];
		result.variance += (val - result.mean) * (val - result.mean);
	}

	result.variance /= (double)values.size();

	{
		const int n = (int)(values.size()/2);

		vector<deUint64> sortedValues = values;

		std::sort(sortedValues.begin(), sortedValues.end());

		result.median = (double)sortedValues[n];
	}

	for (int i = 0; i < (int)values.size(); i++)
	{
		result.min = std::min(result.min, values[i]);
		result.max = std::max(result.max, values[i]);
	}

	return result;
}